

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

string * __thiscall Location::format_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  ostream *this_00;
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_190,*(char **)this,*(long *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
  *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
       *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ostream::operator<<(this_00,*(int *)(this + 0x20));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string Location::format(void) const

{
  ostringstream s;
  s << filename << ":" << dec << lineno;
  return s.str();
}